

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *alloc;
  ForeachLoopListSyntax *node;
  ForeachLoopStatementSyntax *pFVar1;
  Token TVar2;
  BumpAllocator *unaff_retaddr;
  BumpAllocator *in_stack_00000068;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000070;
  BumpAllocator *in_stack_00000108;
  Token *in_stack_00000110;
  BumpAllocator *in_stack_ffffffffffffffb8;
  ForeachLoopListSyntax *in_stack_ffffffffffffffc0;
  NamedLabelSyntax *local_38;
  
  if (*(long *)(__fn + 0x18) == 0) {
    local_38 = (NamedLabelSyntax *)0x0;
  }
  else {
    local_38 = deepClone<slang::syntax::NamedLabelSyntax>
                         ((NamedLabelSyntax *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  alloc = deepClone<slang::syntax::AttributeInstanceSyntax>(in_stack_00000070,in_stack_00000068);
  TVar2 = parsing::Token::deepClone(in_stack_00000110,in_stack_00000108);
  not_null<slang::syntax::ForeachLoopListSyntax_*>::operator*
            ((not_null<slang::syntax::ForeachLoopListSyntax_*> *)0x81ada3);
  node = deepClone<slang::syntax::ForeachLoopListSyntax>
                   (in_stack_ffffffffffffffc0,(BumpAllocator *)alloc);
  not_null<slang::syntax::StatementSyntax_*>::operator*
            ((not_null<slang::syntax::StatementSyntax_*> *)0x81adc3);
  deepClone<slang::syntax::StatementSyntax>((StatementSyntax *)node,(BumpAllocator *)alloc);
  pFVar1 = BumpAllocator::
           emplace<slang::syntax::ForeachLoopStatementSyntax,slang::syntax::NamedLabelSyntax*,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::ForeachLoopListSyntax&,slang::syntax::StatementSyntax&>
                     (unaff_retaddr,(NamedLabelSyntax **)__fn,
                      (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)__child_stack,
                      (Token *)local_38,(ForeachLoopListSyntax *)TVar2.info,TVar2._0_8_);
  return (int)pFVar1;
}

Assistant:

static SyntaxNode* clone(const ForeachLoopStatementSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ForeachLoopStatementSyntax>(
        node.label ? deepClone(*node.label, alloc) : nullptr,
        *deepClone(node.attributes, alloc),
        node.keyword.deepClone(alloc),
        *deepClone<ForeachLoopListSyntax>(*node.loopList, alloc),
        *deepClone<StatementSyntax>(*node.statement, alloc)
    );
}